

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  ImGuiContext *g;
  ImGuiHoveredFlags flags_local;
  
  pIVar1 = GImGui;
  if ((flags & 0x40U) != 0) {
    __assert_fail("(flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0x18aa,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
  }
  if ((flags & 4U) == 0) {
    uVar3 = flags & 3;
    if (uVar3 == 1) {
      if ((GImGui->HoveredWindow == (ImGuiWindow *)0x0) ||
         (bVar2 = IsWindowChildOf(GImGui->HoveredWindow,GImGui->CurrentWindow), !bVar2)) {
        return false;
      }
    }
    else if (uVar3 == 2) {
      if (GImGui->HoveredWindow != GImGui->CurrentWindow->RootWindow) {
        return false;
      }
    }
    else if (uVar3 == 3) {
      if (GImGui->HoveredRootWindow != GImGui->CurrentWindow->RootWindow) {
        return false;
      }
    }
    else if (GImGui->HoveredWindow != GImGui->CurrentWindow) {
      return false;
    }
  }
  else if (GImGui->HoveredWindow == (ImGuiWindow *)0x0) {
    return false;
  }
  bVar2 = IsWindowContentHoverable(pIVar1->HoveredWindow,flags);
  if (bVar2) {
    if (((((flags & 0x20U) == 0) && (pIVar1->ActiveId != 0)) &&
        ((pIVar1->ActiveIdAllowOverlap & 1U) == 0)) &&
       (pIVar1->ActiveId != pIVar1->HoveredWindow->MoveId)) {
      g._7_1_ = false;
    }
    else {
      g._7_1_ = true;
    }
  }
  else {
    g._7_1_ = false;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;

    if (flags & ImGuiHoveredFlags_AnyWindow)
    {
        if (g.HoveredWindow == NULL)
            return false;
    }
    else
    {
        switch (flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows))
        {
        case ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredRootWindow != g.CurrentWindow->RootWindow)
                return false;
            break;
        case ImGuiHoveredFlags_RootWindow:
            if (g.HoveredWindow != g.CurrentWindow->RootWindow)
                return false;
            break;
        case ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow == NULL || !IsWindowChildOf(g.HoveredWindow, g.CurrentWindow))
                return false;
            break;
        default:
            if (g.HoveredWindow != g.CurrentWindow)
                return false;
            break;
        }
    }

    if (!IsWindowContentHoverable(g.HoveredWindow, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != g.HoveredWindow->MoveId)
            return false;
    return true;
}